

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

int matchmemaddr(easm_expr **iex,easm_expr **niex1,easm_expr **niex2,easm_expr *expr,int flip)

{
  easm_expr_type eVar1;
  int iVar2;
  
  do {
    while( true ) {
      iVar2 = easm_isimm(expr);
      if (iVar2 != 0) {
        addexpr(iex,expr,flip);
        return 1;
      }
      eVar1 = expr->type;
      if (eVar1 != EASM_EXPR_ADD) break;
      iVar2 = matchmemaddr(iex,niex1,niex2,expr->e1,flip);
      if (iVar2 == 0) {
        return 0;
      }
      expr = expr->e2;
    }
    if (eVar1 == EASM_EXPR_SUB) {
      iVar2 = matchmemaddr(iex,niex1,niex2,expr->e1,flip);
      if (iVar2 == 0) {
        return 0;
      }
      expr = expr->e2;
    }
    else {
      if (eVar1 != EASM_EXPR_NEG) {
        if (flip != 0) {
          return 0;
        }
        if ((niex1 != (easm_expr **)0x0) && (*niex1 == (easm_expr *)0x0)) {
          *niex1 = expr;
          return 1;
        }
        if (niex2 == (easm_expr **)0x0) {
          return 0;
        }
        if (*niex2 == (easm_expr *)0x0) {
          *niex2 = expr;
          return 1;
        }
        return 0;
      }
      expr = expr->e1;
    }
    flip = (int)(flip == 0);
  } while( true );
}

Assistant:

int matchmemaddr(struct easm_expr **iex, struct easm_expr **niex1, struct easm_expr **niex2, struct easm_expr *expr, int flip) {
	if (easm_isimm(expr))
		return addexpr(iex, expr, flip);
	if (expr->type == EASM_EXPR_ADD)
		return matchmemaddr(iex, niex1, niex2, expr->e1, flip) && matchmemaddr(iex, niex1, niex2, expr->e2, flip);
	if (expr->type == EASM_EXPR_SUB)
		return matchmemaddr(iex, niex1, niex2, expr->e1, flip) && matchmemaddr(iex, niex1, niex2, expr->e2, !flip);
	if (expr->type == EASM_EXPR_NEG)
		return matchmemaddr(iex, niex1, niex2, expr->e1, !flip);
	if (flip)
		return 0;
	if (niex1 && !*niex1)
		*niex1 = expr;
	else if (niex2 && !*niex2)
		*niex2 = expr;
	else
		return 0;
	return 1;
}